

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteGraph.cpp
# Opt level: O0

void __thiscall dg::dda::RWSubgraph::splitBBlocksOnCalls(RWSubgraph *this)

{
  bool bVar1;
  iterator iVar2;
  vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
  *newblocks_00;
  vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
  *in_RDI;
  unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *bblock_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
  *__range2_1;
  RWBBlock *cur;
  unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *bblock;
  iterator __end2;
  iterator __begin2;
  BBlocksVecT *__range2;
  vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
  newblocks;
  vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
  *in_stack_ffffffffffffff88;
  vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
  local_58;
  undefined1 *local_50;
  pointer local_48;
  __normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
  local_30 [2];
  undefined1 local_20 [32];
  
  bVar1 = std::
          vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
          ::empty(in_stack_ffffffffffffffa0);
  if (!bVar1) {
    std::
    vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
    ::vector((vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
              *)0x16a91d);
    local_30[0]._M_current =
         (unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)
         std::
         vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
         ::begin(in_stack_ffffffffffffff88);
    iVar2 = std::
            vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
            ::end(in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
                               *)in_RDI,
                              (__normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
                               *)in_stack_ffffffffffffff88), bVar1) {
      newblocks_00 = (vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
                      *)__gnu_cxx::
                        __normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
                        ::operator*(local_30);
      local_48 = std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>::get
                           ((unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>
                             *)0x16a973);
      while (local_48 != (pointer)0x0) {
        local_48 = splitBlockOnFirstCall((RWBBlock *)iVar2._M_current,newblocks_00);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
      ::operator++(local_30);
    }
    local_50 = local_20;
    local_58._M_current =
         (unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)
         std::
         vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
         ::begin(in_stack_ffffffffffffff88);
    iVar2 = std::
            vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
            ::end(in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
                               *)in_RDI,
                              (__normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
                               *)in_stack_ffffffffffffff88), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
      ::operator*(&local_58);
      std::
      vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
      ::push_back(in_RDI,(value_type *)in_stack_ffffffffffffff88);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
      ::operator++(&local_58);
    }
    std::
    vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
    ::~vector((vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>
               *)iVar2._M_current);
  }
  return;
}

Assistant:

void RWSubgraph::splitBBlocksOnCalls() {
    DBG_SECTION_BEGIN(dda, "Splitting basic blocks on calls");
    if (_bblocks.empty()) {
        DBG_SECTION_END(dda, "Splitting basic blocks on calls finished");
        return;
    }

#ifndef NDEBUG
    auto *entry = _bblocks[0].get();
#endif

    std::vector<std::unique_ptr<RWBBlock>> newblocks;

    for (auto &bblock : _bblocks) {
        auto *cur = bblock.get();
        while (cur) {
            cur = splitBlockOnFirstCall(cur, newblocks);
        }
    }

    for (auto &bblock : newblocks) {
        _bblocks.push_back(std::move(bblock));
    }

    assert(entry == _bblocks[0].get() &&
           "splitBBlocksOnCalls() changed the entry");
    DBG_SECTION_END(dda, "Splitting basic blocks on calls finished");
}